

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

bool llvm::sys::path::has_root_path(Twine *path,Style style)

{
  StringRef SVar1;
  undefined1 local_a0 [8];
  SmallString<128U> path_storage;
  
  local_a0 = (undefined1  [8])
             &path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Size;
  path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x8000000000;
  SVar1 = Twine::toStringRef(path,(SmallVectorImpl<char> *)local_a0);
  SVar1 = root_path(SVar1,style);
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_a0);
  return SVar1.Length != 0;
}

Assistant:

bool has_root_path(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !root_path(p, style).empty();
}